

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON__UINT32 __thiscall
ON_XMLNode::ReadFromStream
          (ON_XMLNode *this,wchar_t *stream,bool bWarningsAsErrors,bool bValidateTags)

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  ON_XMLNode *this_00;
  ON_XMLProperty *this_01;
  undefined4 extraout_var;
  ON_XMLVariant *pOVar4;
  undefined4 extraout_var_00;
  int local_1e8;
  ON_wString local_198;
  ON_XMLVariant local_190;
  ON_XMLVariant *local_98;
  ON_XMLVariant *v;
  ON_XMLProperty *pOStack_88;
  int pos2;
  ON_XMLProperty *pProp;
  ON_XMLNode *pOStack_78;
  ON__UINT32 read;
  ON_XMLNode *pNode;
  wchar_t *start;
  wchar_t *pStoreBuffer;
  bool bClosingTag;
  ON_wString sDefaultProperty;
  int pos1;
  ON_wString tag;
  wchar_t *pBuffer;
  CWarningHelper local_23;
  byte local_22;
  byte local_21;
  CWarningHelper wh;
  bool bValidateTags_local;
  wchar_t *pwStack_20;
  bool bWarningsAsErrors_local;
  wchar_t *stream_local;
  ON_XMLNode *this_local;
  
  local_22 = bValidateTags;
  local_21 = bWarningsAsErrors;
  pwStack_20 = stream;
  if (stream == (wchar_t *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0xd8e,"","Stream cannot be null");
    return 0xffffffff;
  }
  CWarningHelper::CWarningHelper(&local_23,bWarningsAsErrors);
  (*this->_vptr_ON_XMLNode[0x14])();
  tag.m_s = pwStack_20;
  ON_wString::ON_wString((ON_wString *)&pos1);
  bVar1 = ON_XMLNodePrivate::GetNextTag((ON_wString *)&pos1,&tag.m_s,(bool)(local_22 & 1));
  if (bVar1) {
    bVar1 = ON_wString::IsEmpty((ON_wString *)&pos1);
    if (bVar1) {
      this_local._4_4_ = 0xffffffff;
      sDefaultProperty.m_s._4_4_ = 1;
    }
    else {
      this->_private->m_last_read_buf_ptr = pwStack_20;
      ON_XMLNodePrivate::GetPropertiesFromTag(this->_private,(ON_wString *)&pos1);
      iVar2 = ON_wString::Length((ON_wString *)&pos1);
      sDefaultProperty.m_s._0_4_ = iVar2 + -2;
      pwVar3 = ON_wString::operator[]((ON_wString *)&pos1,(int)sDefaultProperty.m_s);
      if (*pwVar3 != L'/') {
        ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffffa8);
        pStoreBuffer._7_1_ = 0;
        do {
          start = tag.m_s;
          pNode = (ON_XMLNode *)tag.m_s;
          while( true ) {
            bVar1 = false;
            if (*(int *)&pNode->_vptr_ON_XMLNode != 0x3c) {
              bVar1 = *(int *)&pNode->_vptr_ON_XMLNode != 0;
            }
            if (!bVar1) break;
            pNode = (ON_XMLNode *)((long)&pNode->_vptr_ON_XMLNode + 4);
          }
          if (*(int *)&pNode->_vptr_ON_XMLNode == 0) {
            this_local._4_4_ = 0xffffffff;
            sDefaultProperty.m_s._4_4_ = 1;
            goto LAB_009b44c1;
          }
          ON_REMOVE_ASAP_AssertEx
                    ((uint)(*(int *)&pNode->_vptr_ON_XMLNode == 0x3c),
                     "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
                     ,0xdc2,"","*start == L\'<\' is false");
          if ((pNode != (ON_XMLNode *)0x0) && (*(int *)&pNode->_vptr_ON_XMLNode == 0x3c)) {
            ON_wString::Append((ON_wString *)&stack0xffffffffffffffa8,tag.m_s,
                               (int)((ulong)((long)pNode - (long)tag.m_s) >> 2));
          }
          tag.m_s = (wchar_t *)pNode;
          bVar1 = ON_XMLNodePrivate::GetNextTag((ON_wString *)&pos1,&tag.m_s,(bool)(local_22 & 1));
          if (!bVar1) {
            this_local._4_4_ = 0xffffffff;
            sDefaultProperty.m_s._4_4_ = 1;
            goto LAB_009b44c1;
          }
          pStoreBuffer._7_1_ = ON_XMLNodePrivate::IsClosingTag(this->_private,(ON_wString *)&pos1);
          if (!(bool)pStoreBuffer._7_1_) {
            this_00 = (ON_XMLNode *)operator_new(0xe8);
            ON_XMLNode(this_00,L"");
            pOStack_78 = this_00;
            (*this->_vptr_ON_XMLNode[0xb])(this,this_00);
            pProp._4_4_ = (*pOStack_78->_vptr_ON_XMLNode[0x17])
                                    (pOStack_78,start,(ulong)(local_21 & 1),(ulong)(local_22 & 1));
            if (pProp._4_4_ == 0xffffffff) {
              this_local._4_4_ = 0xffffffff;
              sDefaultProperty.m_s._4_4_ = 1;
              goto LAB_009b44c1;
            }
            tag.m_s = start + pProp._4_4_;
          }
        } while (((pStoreBuffer._7_1_ ^ 0xff) & 1) != 0);
        ON_wString::TrimLeft((ON_wString *)&stack0xffffffffffffffa8,(wchar_t *)0x0);
        ON_wString::TrimRight((ON_wString *)&stack0xffffffffffffffa8,(wchar_t *)0x0);
        DecodeXML((ON_wString *)&stack0xffffffffffffffa8);
        bVar1 = ON_wString::IsEmpty((ON_wString *)&stack0xffffffffffffffa8);
        if (!bVar1) {
          this_01 = (ON_XMLProperty *)operator_new(0x68);
          ON_XMLProperty::ON_XMLProperty(this_01);
          pOStack_88 = this_01;
          (*this->_vptr_ON_XMLNode[0xc])(this,this_01);
          if ((ON_XMLNodePrivate::m_bAutoTypePropValue & 1U) == 0) {
            local_1e8 = -1;
          }
          else {
            local_1e8 = ON_wString::Find((ON_wString *)&stack0xffffffffffffffa8,L":");
          }
          v._4_4_ = local_1e8;
          if (local_1e8 < 1) {
            ON_XMLPropertyPrivate::SetHugeStringValue
                      (pOStack_88->_private,(ON_wString *)&stack0xffffffffffffffa8);
            pOVar4 = ON_XMLPropertyPrivate::GetNonConstValue(pOStack_88->_private);
            (*pOVar4->_vptr_ON_XMLVariant[0x2f])(pOVar4,1);
          }
          else {
            iVar2 = (*pOStack_88->_vptr_ON_XMLProperty[9])();
            local_98 = (ON_XMLVariant *)CONCAT44(extraout_var,iVar2);
            ON_wString::Mid(&local_198,(int)&stack0xffffffffffffffa8);
            ::ON_XMLVariant::ON_XMLVariant(&local_190,&local_198);
            ::ON_XMLVariant::operator=(local_98,&local_190);
            ::ON_XMLVariant::~ON_XMLVariant(&local_190);
            ON_wString::~ON_wString(&local_198);
            (*local_98->_vptr_ON_XMLVariant[0x2f])(local_98,1);
          }
        }
        sDefaultProperty.m_s._4_4_ = 0;
LAB_009b44c1:
        ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffa8);
        if (sDefaultProperty.m_s._4_4_ != 0) goto LAB_009b4572;
      }
      iVar2 = (*this->_vptr_ON_XMLNode[9])();
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 200))
                ((long *)CONCAT44(extraout_var_00,iVar2),this);
      while( true ) {
        bVar1 = true;
        if (*tag.m_s != L'\r') {
          bVar1 = *tag.m_s == L'\n';
        }
        if (!bVar1) break;
        tag.m_s = tag.m_s + 1;
      }
      this_local._4_4_ = (ON__UINT32)((long)tag.m_s - (long)pwStack_20 >> 2);
      sDefaultProperty.m_s._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
    sDefaultProperty.m_s._4_4_ = 1;
  }
LAB_009b4572:
  ON_wString::~ON_wString((ON_wString *)&pos1);
  CWarningHelper::~CWarningHelper(&local_23);
  return this_local._4_4_;
}

Assistant:

ON__UINT32 ON_XMLNode::ReadFromStream(const wchar_t* stream, bool bWarningsAsErrors, bool bValidateTags)
{
  if (nullptr == stream)
  {
    ON_ERROR("Stream cannot be null");
    return ReadError;
  }

  CWarningHelper wh(bWarningsAsErrors);

  Clear();

  // Search for the opening tag "<" character.
  wchar_t* pBuffer = const_cast<wchar_t*>(stream);

  ON_wString tag;

  // 1st August 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-66795
  // The original code was not checking GetNextTag() for failure and blindly continuing with an empty tag.
  // Then in some places it assumed that the tag was not empty. This is confusing because I thought
  // this was causing RH-66795, but it couldn't be because this bug was not in 7.x, and RH-66795 is 7.13.
  if (!_private->GetNextTag(tag, pBuffer, bValidateTags))
    return ReadError;

  if (tag.IsEmpty())
    return ReadError;

  _private->m_last_read_buf_ptr = (void*)stream;

  _private->GetPropertiesFromTag(tag);

  const auto pos1 = tag.Length() - 2; // Assumes the tag is not empty.
  if (tag[pos1] != L'/')
  {
    // This tag either has children, or a default property.
    ON_wString sDefaultProperty;

    bool bClosingTag = false;
    do
    {
      auto* pStoreBuffer = pBuffer;

      // Get anything between the tags and store as the default parameter.
      auto* start = pBuffer;
      while ((*start != L'<') && (*start != 0))
      {
        start++;
      }

      if (0 == *start)
      {
        // We ran off the end of the buffer - no idea why, but this is bad, so fail.
        // See http://mcneel.myjetbrains.com/youtrack/issue/RH-16605 for example.
        return ReadError;
      }

      ON_ASSERT(*start == L'<');

      if (nullptr != start && *start == L'<')
      {
        sDefaultProperty.Append(pBuffer, (int)(start - pBuffer));
      }

      pBuffer = start;

      // 1st August 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-66795
      // The original code was not checking GetNextTag() for failure and blindly continuing with
      // an empty tag. This caused continuous child recursion because the buffer pointer was
      // still pointing at the same (bad) XML. This is confusing because I thought this was causing
      // RH-66795, but it couldn't be because this bug was not in 7.x, and RH-66795 is 7.13.
      if (!_private->GetNextTag(tag, pBuffer, bValidateTags))
        return ReadError;

      bClosingTag = _private->IsClosingTag(tag);

      if (!bClosingTag)
      {
        auto* pNode = new ON_XMLNode(L"");
        AttachChildNode(pNode);

        const auto read = pNode->ReadFromStream(pStoreBuffer, bWarningsAsErrors, bValidateTags);
        if (ReadError == read)
          return ReadError;

        pBuffer = pStoreBuffer + read;
      }
    }
    while (!bClosingTag);

    sDefaultProperty.TrimLeft();
    sDefaultProperty.TrimRight();
    DecodeXML(sDefaultProperty);

    if (!sDefaultProperty.IsEmpty())
    {
      auto* pProp = new ON_XMLProperty;
      AttachProperty(pProp);

      const int pos2 = ON_XMLNodePrivate::m_bAutoTypePropValue ? sDefaultProperty.Find(L":") : -1;
      if (pos2 > 0)
      {
        auto& v = pProp->GetNonConstValue();
        v = sDefaultProperty.Mid(pos2 + 1);
        v.SetTypePendingFlag(true);
      }
      else
      {
        pProp->_private->SetHugeStringValue(sDefaultProperty);
        pProp->_private->GetNonConstValue().SetTypePendingFlag(true);
      }
    }
  }

  TopLevel().OnNodeReadFromStream(this);

  while ((*pBuffer == L'\r') || (*pBuffer == L'\n'))
    pBuffer++;

  return ON__UINT32(pBuffer - stream);
}